

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.h
# Opt level: O2

void __thiscall AI::Task::Task(Task *this,Task *param_1)

{
  pointer pTVar1;
  int iVar2;
  TaskIdentifier TVar3;
  bool bVar4;
  
  Condition::Condition(&this->preconditions,&param_1->preconditions);
  Condition::Condition(&this->postconditions,&param_1->postconditions);
  Condition::Condition(&this->breakConditions,&param_1->breakConditions);
  this->type = param_1->type;
  pTVar1 = (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar1;
  (this->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->remainingRepeats = param_1->remainingRepeats;
  iVar2 = param_1->maxRepeats;
  this->parentTaskIndex = param_1->parentTaskIndex;
  this->maxRepeats = iVar2;
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->modifiedFlags)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->modifiedFlags)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->modifiedValues)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->modifiedValues)._M_t._M_impl.super__Rb_tree_header);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->modifiedVectors)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->modifiedVectors)._M_t._M_impl.super__Rb_tree_header);
  TVar3 = param_1->identifier;
  this->action = param_1->action;
  this->identifier = TVar3;
  std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::function
            (&this->setup,&param_1->setup);
  std::function<void_(AI::WorldState_&,_AI::Task_&)>::function(&this->finish,&param_1->finish);
  std::function<void_(AI::WorldState_&)>::function(&this->finally,&param_1->finally);
  std::function<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&)>::function
            (&this->loop,&param_1->loop);
  std::__cxx11::string::string((string *)&this->debugName,(string *)&param_1->debugName);
  this->failed = param_1->failed;
  bVar4 = param_1->isLastInCompound;
  this->isImmediate = param_1->isImmediate;
  this->isLastInCompound = bVar4;
  TaskParameters::TaskParameters(&this->parameters,&param_1->parameters);
  return;
}

Assistant:

Task(std::string debugName, TaskType type = TaskType::Simple)
			: type{type}, debugName{debugName}
			{}